

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

void __thiscall
soplex::SoPlexBase<double>::getRowVectorReal
          (SoPlexBase<double> *this,int i,DSVectorBase<double> *row)

{
  int iVar1;
  int iVar2;
  SPxLPBase<double> *pSVar3;
  Item *pIVar4;
  
  pSVar3 = this->_realLP;
  pIVar4 = (pSVar3->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
  iVar1 = (pSVar3->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[i].idx;
  if (pSVar3->_isScaled == true) {
    iVar1 = pIVar4[iVar1].data.super_SVectorBase<double>.memused;
    iVar2 = (row->super_SVectorBase<double>).memused;
    if (iVar1 < iVar2) {
      iVar1 = iVar2;
    }
    spx_realloc<soplex::Nonzero<double>*>(&row->theelem,iVar1);
    (row->super_SVectorBase<double>).m_elem = row->theelem;
    (row->super_SVectorBase<double>).memsize = iVar1;
    (row->super_SVectorBase<double>).memused = iVar2;
    (*this->_scaler->_vptr_SPxScaler[0x1a])(this->_scaler,this->_realLP,i,row);
    return;
  }
  DSVectorBase<double>::operator=(row,(SVectorBase<double> *)(pIVar4 + iVar1));
  return;
}

Assistant:

void SoPlexBase<R>::getRowVectorReal(int i, DSVectorBase<R>& row) const
{
   assert(_realLP);

   if(_realLP->isScaled())
   {
      assert(_scaler);
      row.setMax(_realLP->rowVector(i).size());
      _scaler->getRowUnscaled(*_realLP, i, row);
   }
   else
      row = _realLP->rowVector(i);
}